

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadTuple.h
# Opt level: O2

void __thiscall QuadTuple::printWithAct(QuadTuple *this,ofstream *out)

{
  ostream *poVar1;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
  poVar1 = std::operator<<((ostream *)out,(string *)this);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::operator<<(poVar1,(string *)&this->name1);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,")");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::operator<<(poVar1,(string *)&this->name2);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,")");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::operator<<(poVar1,(string *)&this->res);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printWithAct(ofstream& out) {
        out << setw(8) << op << setw(8) << name1 << "(" << name1Act  << ")" << setw(8) << name2 << "(" << name2Act  << ")"
        << setw(8) << res << "(" << resAct  << ")" << endl;
    }